

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps.c
# Opt level: O0

void fps_tick(FPS *fps)

{
  FPS *fps_local;
  
  fps->curSample = fps->curSample + 1;
  fps->curSample = fps->curSample % fps->nSamples;
  fps->framesPerSecond = fps->framesPerSecond - fps->samples[fps->curSample];
  fps->framesPerSecond = fps->frameCounter + fps->framesPerSecond;
  fps->samples[fps->curSample] = fps->frameCounter;
  fps->frameCounter = 0;
  return;
}

Assistant:

void fps_tick(FPS * fps)
{
   fps->curSample++;
   fps->curSample %= fps->nSamples;
   fps->framesPerSecond -= fps->samples[fps->curSample];
   fps->framesPerSecond += fps->frameCounter;
   fps->samples[fps->curSample] = fps->frameCounter;
   fps->frameCounter = 0;
}